

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movDemuxer.cpp
# Opt level: O2

uint __thiscall
MovParsedH264TrackData::newBufferSize(MovParsedH264TrackData *this,uint8_t *buff,uint size)

{
  uint uVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *i;
  pointer pvVar2;
  ostream *poVar3;
  undefined4 *puVar4;
  int iVar5;
  uint8_t *puVar6;
  int iVar7;
  uint *local_1e0;
  undefined8 local_1d8;
  uint local_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  uint *local_1c0;
  undefined8 local_1b8;
  uint local_1b0;
  undefined4 uStack_1ac;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  ostringstream ss;
  
  puVar6 = buff + size;
  iVar7 = 0;
  while( true ) {
    if (puVar6 <= buff) {
      iVar5 = 0;
      for (pvVar2 = (this->spsPpsList).
                    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pvVar2 != (this->spsPpsList).
                    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pvVar2 = pvVar2 + 1) {
        iVar5 = iVar5 + (*(int *)&(pvVar2->
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                                  ._M_impl.super__Vector_impl_data._M_finish -
                        *(int *)&(pvVar2->
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                 _M_impl.super__Vector_impl_data._M_start) + 4;
      }
      return (4 - (uint)this->nal_length_size) * iVar7 + iVar5 + size;
    }
    if (puVar6 < buff + this->nal_length_size) break;
    uVar1 = getNalSize(this,buff);
    buff = buff + (ulong)this->nal_length_size + (ulong)uVar1;
    if (puVar6 < buff) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
      poVar3 = std::operator<<((ostream *)&ss,"MP4/MOV error: Invalid H.264/AVC frame at position ")
      ;
      std::ostream::_M_insert<long>((long)poVar3);
      puVar4 = (undefined4 *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      *puVar4 = 0x3b6;
      *(undefined4 **)(puVar4 + 2) = puVar4 + 6;
      if (local_1e0 == &local_1d0) {
        puVar4[6] = local_1d0;
        puVar4[7] = uStack_1cc;
        puVar4[8] = uStack_1c8;
        puVar4[9] = uStack_1c4;
      }
      else {
        *(uint **)(puVar4 + 2) = local_1e0;
        *(ulong *)(puVar4 + 6) = CONCAT44(uStack_1cc,local_1d0);
      }
      *(undefined8 *)(puVar4 + 4) = local_1d8;
      local_1d0 = local_1d0 & 0xffffff00;
      __cxa_throw(puVar4,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
    }
    iVar7 = iVar7 + 1;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  poVar3 = std::operator<<((ostream *)&ss,"MP4/MOV error: Invalid H.264/AVC frame at position ");
  std::ostream::_M_insert<long>((long)poVar3);
  puVar4 = (undefined4 *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  *puVar4 = 0x3b6;
  *(undefined4 **)(puVar4 + 2) = puVar4 + 6;
  if (local_1c0 == &local_1b0) {
    puVar4[6] = local_1b0;
    puVar4[7] = uStack_1ac;
    puVar4[8] = uStack_1a8;
    puVar4[9] = uStack_1a4;
  }
  else {
    *(uint **)(puVar4 + 2) = local_1c0;
    *(ulong *)(puVar4 + 6) = CONCAT44(uStack_1ac,local_1b0);
  }
  *(undefined8 *)(puVar4 + 4) = local_1b8;
  local_1b8 = 0;
  local_1b0 = local_1b0 & 0xffffff00;
  local_1c0 = &local_1b0;
  __cxa_throw(puVar4,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
}

Assistant:

unsigned newBufferSize(uint8_t* buff, const unsigned size) override
    {
        const uint8_t* end = buff + size;
        unsigned nalCnt = 0;
        while (buff < end)
        {
            if (buff + nal_length_size > end)
                THROW(ERR_MOV_PARSE,
                      "MP4/MOV error: Invalid H.264/AVC frame at position " << m_demuxer->getProcessedBytes())
            const uint32_t nalSize = getNalSize(buff);
            buff += nal_length_size;
            if (buff + nalSize > end)
                THROW(ERR_MOV_PARSE,
                      "MP4/MOV error: Invalid H.264/AVC frame at position " << m_demuxer->getProcessedBytes())
            buff += nalSize;
            ++nalCnt;
        }
        unsigned spsPpsSize = 0;
        for (auto& i : spsPpsList) spsPpsSize += static_cast<uint32_t>(i.size() + 4);

        return size + spsPpsSize + nalCnt * (4 - nal_length_size);
    }